

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_endec.hxx
# Opt level: O0

void __thiscall
cryptox::
evp_cipher_context<cryptox::symmetric_algorithm<&EVP_seed_ofb>,_&EVP_EncryptInit_ex,_&EVP_EncryptUpdate,_&EVP_EncryptFinal_ex>
::reset(evp_cipher_context<cryptox::symmetric_algorithm<&EVP_seed_ofb>,_&EVP_EncryptInit_ex,_&EVP_EncryptUpdate,_&EVP_EncryptFinal_ex>
        *this)

{
  int iVar1;
  source_location local_60;
  evp_error local_48;
  evp_cipher_context<cryptox::symmetric_algorithm<&EVP_seed_ofb>,_&EVP_EncryptInit_ex,_&EVP_EncryptUpdate,_&EVP_EncryptFinal_ex>
  *local_10;
  evp_cipher_context<cryptox::symmetric_algorithm<&EVP_seed_ofb>,_&EVP_EncryptInit_ex,_&EVP_EncryptUpdate,_&EVP_EncryptFinal_ex>
  *this_local;
  
  local_10 = this;
  iVar1 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)this->_context,(EVP_CIPHER *)0x0,(ENGINE *)0x0,
                             (uchar *)0x0,(uchar *)0x0);
  if (iVar1 != 1) {
    local_48._32_8_ = 0;
    local_48._40_8_ = 0;
    local_48._16_8_ = 0;
    local_48._24_8_ = 0;
    local_48._0_8_ = 0;
    local_48._8_8_ = 0;
    evp_error::evp_error(&local_48);
    boost::source_location::source_location
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/include/cryptox/symmetric/basic_endec.hxx"
               ,0x44,
               "void cryptox::evp_cipher_context<cryptox::symmetric_algorithm<&EVP_seed_ofb>, &EVP_EncryptInit_ex, &EVP_EncryptUpdate, &EVP_EncryptFinal_ex>::reset() [Algorithm = cryptox::symmetric_algorithm<&EVP_seed_ofb>, InitFx = &EVP_EncryptInit_ex, UpdateFx = &EVP_EncryptUpdate, FinalFx = &EVP_EncryptFinal_ex]"
               ,0);
    boost::throw_exception<cryptox::evp_error>(&local_48,&local_60);
  }
  padding(this,this->_padding);
  this->_total_input = 0;
  this->_total_output = 0;
  return;
}

Assistant:

void reset() {
			if (InitFx(_context, 0, 0, 0, 0) != 1)
				BOOST_THROW_EXCEPTION(evp_error(/* TODO */));

			padding(_padding);

			_total_input = 0;
			_total_output = 0;
		}